

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

Term * Inferences::getPlaceholderForTerm
                 (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *ts,uint i)

{
  pair<Kernel::TermList,_unsigned_int> key;
  bool bVar1;
  int iVar2;
  uint uVar3;
  TermList resultSort;
  Term *pTVar4;
  Term **ppTVar5;
  uint in_ESI;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_RDI;
  pair<Kernel::TermList,_unsigned_int> pVar6;
  char *unaff_retaddr;
  uint in_stack_0000000c;
  Signature *in_stack_00000010;
  Term *res;
  uint fresh;
  pair<Kernel::TermList,_unsigned_int> p;
  TermList srt;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  Signature *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  pair<Kernel::TermList,_unsigned_int> *in_stack_fffffffffffffee0;
  DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this;
  DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffee8;
  TermList TVar7;
  undefined8 in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e0 [32];
  string local_c0 [8];
  Term *in_stack_ffffffffffffff48;
  string local_a0 [32];
  string local_80 [36];
  uint local_5c;
  uint64_t local_50;
  uint local_48;
  uint64_t local_40;
  uint local_38;
  uint64_t local_30;
  uint local_14;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *local_10;
  char *in_stack_fffffffffffffff8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
      ::placeholders == '\0') {
    iVar2 = __cxa_guard_acquire(&getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
                                 ::placeholders);
    if (iVar2 != 0) {
      Lib::
      DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::DHMap(&getPlaceholderForTerm::placeholders);
      __cxa_atexit(Lib::
                   DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::~DHMap,&getPlaceholderForTerm::placeholders,&__dso_handle);
      __cxa_guard_release(&getPlaceholderForTerm(std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>const&,unsigned_int)
                           ::placeholders);
    }
  }
  std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::operator[](local_10,(ulong)local_14)
  ;
  local_30 = (uint64_t)Kernel::SortHelper::getResultSort(in_stack_ffffffffffffff48);
  pVar6 = std::make_pair<Kernel::TermList&,unsigned_int&>
                    ((TermList *)in_stack_fffffffffffffed0,
                     (uint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_50 = (uint64_t)pVar6.first._content;
  local_48 = pVar6.second;
  local_40 = local_50;
  local_38 = local_48;
  Lib::
  DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  bVar1 = Lib::Option::operator_cast_to_bool((Option<Kernel::Term_*&> *)0x7c6c95);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    key.first._content._4_4_ = in_stack_fffffffffffffedc;
    key.first._content._0_4_ = in_stack_fffffffffffffed8;
    key._8_8_ = in_stack_fffffffffffffee0;
    ppTVar5 = Lib::
              DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::get((DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                     *)in_stack_fffffffffffffed0,key);
    pTVar4 = *ppTVar5;
  }
  else {
    TVar7._content = (uint64_t)local_c0;
    this = DAT_01333830;
    Kernel::TermList::toString_abi_cxx11_
              ((TermList *)in_stack_ffffffffffffff08,
               SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (char *)in_stack_fffffffffffffed0);
    Lib::Int::toString_abi_cxx11_(in_stack_0000000c);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    uVar3 = Kernel::Signature::addFreshFunction
                      (in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_stack_fffffffffffffff8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    local_5c = uVar3;
    resultSort._content =
         (uint64_t)
         Kernel::Signature::getFunction(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    Kernel::OperatorType::getConstantsType(resultSort,in_stack_fffffffffffffecc);
    Kernel::Signature::Symbol::setType
              ((Symbol *)resultSort._content,
               (OperatorType *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    pTVar4 = Kernel::Term::createConstant(0);
    pVar6._8_8_ = in_stack_fffffffffffffef0;
    pVar6.first._content = TVar7._content;
    Lib::
    DHMap<std::pair<Kernel::TermList,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert(this,pVar6,(Term *)CONCAT44(uVar3,in_stack_fffffffffffffed8));
  }
  return pTVar4;
}

Assistant:

Term* getPlaceholderForTerm(const std::vector<Term*>& ts, unsigned i)
{
  static DHMap<pair<TermList,unsigned>,Term*> placeholders;
  TermList srt = SortHelper::getResultSort(ts[i]);
  auto p = make_pair(srt,i);
  if(!placeholders.find(p)){
    unsigned fresh = env.signature->addFreshFunction(0,(srt.toString() + "_placeholder" + Int::toString(i)).c_str());
    env.signature->getFunction(fresh)->setType(OperatorType::getConstantsType(srt));
    auto res = Term::createConstant(fresh);
    placeholders.insert(p,res);
    return res;
  }
  return placeholders.get(p);
}